

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O0

char RDL_shareEdges(RDL_cfURF *RCFs,uint idx1,uint idx2,RDL_graph *graph,RDL_sPathInfo *spi)

{
  char *edges;
  char *edges_00;
  char local_3d;
  uint local_3c;
  char result;
  uint i;
  char *edges2;
  char *edges1;
  RDL_sPathInfo *spi_local;
  RDL_graph *graph_local;
  uint idx2_local;
  uint idx1_local;
  RDL_cfURF *RCFs_local;
  
  local_3d = '\0';
  edges = (char *)malloc((ulong)graph->E);
  edges_00 = (char *)malloc((ulong)graph->E);
  memset(edges,0,(ulong)graph->E);
  memset(edges_00,0,(ulong)graph->E);
  RDL_findEdges(edges,RCFs->fams[idx1],graph,spi);
  RDL_findEdges(edges_00,RCFs->fams[idx2],graph,spi);
  local_3c = 0;
  do {
    if (graph->E <= local_3c) {
LAB_001117ae:
      free(edges);
      free(edges_00);
      return local_3d;
    }
    if ((edges[local_3c] == '\x01') && (edges_00[local_3c] == '\x01')) {
      local_3d = '\x01';
      goto LAB_001117ae;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

char RDL_shareEdges(RDL_cfURF *RCFs, unsigned idx1, unsigned idx2, RDL_graph *graph,
                    RDL_sPathInfo *spi)
{
  char *edges1;
  char *edges2; /*arrays of {0,1}^m that can store a set of edges with entries
  being 1 if the edge is contained and 0 otherwise*/
  unsigned i;
  char result = 0;
  edges1 = malloc(graph->E * sizeof(*edges1));
  edges2 = malloc(graph->E * sizeof(*edges2));

  memset(edges1, 0, graph->E * sizeof(*edges1));
  memset(edges2, 0, graph->E * sizeof(*edges2));

  RDL_findEdges(edges1, RCFs->fams[idx1], graph, spi);
  RDL_findEdges(edges2, RCFs->fams[idx2], graph, spi);

  for(i=0; i<graph->E; ++i)
  {
    if(edges1[i] == 1 && edges2[i] == 1)
    {
      result = 1;
      break;
    }
  }
  free(edges1);
  free(edges2);
  return result;
}